

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref2b(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_tcp_t h;
  uv_stream_t local_100;
  
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,(uv_tcp_t *)&local_100);
  uv_listen(&local_100,0x80,fail_cb);
  uv_unref((uv_handle_t *)&local_100);
  uv_close((uv_handle_t *)&local_100,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 1) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref2b) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_close((uv_handle_t*)&h, close_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(close_cb_called == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
}